

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O1

void __thiscall LinkedList::printList(LinkedList *this,Node *head)

{
  Node *pNVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  if (head == (Node *)0x0) {
    poVar2 = (ostream *)&std::cout;
    pcVar4 = "Empty Linked List";
    lVar3 = 0x11;
  }
  else {
    if (head->next != (Node *)0x0) {
      pNVar1 = head->next;
      while (pNVar1 != (Node *)0x0) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
        head = head->next;
        pNVar1 = head->next;
      }
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->data);
    pcVar4 = " -> ";
    lVar3 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void LinkedList::printList(Node* head) {
	Node* n = head;

	if (n == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	if (n->next == nullptr) {
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}
	else {
		while (n->next != NULL) {
			std::cout << n->data << " -> ";
			n = n->next;
		}
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}

	// Create new line
	std::cout << std::endl;
}